

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

void __thiscall Assimp::X3DExporter::Export_Mesh(X3DExporter *this,size_t pIdxMesh,size_t pTabLevel)

{
  size_t sVar1;
  bool bVar2;
  char *__lhs;
  mapped_type *pmVar3;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  value_type local_470;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  value_type local_400;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  value_type local_390;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  value_type local_320;
  undefined1 local_2e0 [8];
  string attr_value;
  string local_2b8;
  allocator<char> local_291;
  value_type local_290;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  ulong local_210;
  size_t idx_vert;
  aiFace *face_cur;
  size_t idx_face;
  string coordIndex;
  string local_1d0;
  allocator<char> local_1a9;
  value_type local_1a8;
  string local_168;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string mesh_name;
  string local_d8;
  allocator<char> local_b1;
  value_type local_b0;
  _Self local_70 [3];
  _Self local_58;
  aiMesh *local_50;
  aiMesh *mesh;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  char *NodeName_Shape;
  char *NodeName_IFS;
  size_t pTabLevel_local;
  size_t pIdxMesh_local;
  X3DExporter *this_local;
  
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node._M_size = (long)"BlendShapeChannel -> BlendShape" + 0x1a;
  pTabLevel_local = pIdxMesh;
  pIdxMesh_local = (size_t)this;
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::list
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)&mesh);
  local_50 = this->mScene->mMeshes[pTabLevel_local];
  local_58._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->mDEF_Map_Mesh,&pTabLevel_local);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->mDEF_Map_Mesh);
  bVar2 = std::operator!=(&local_58,local_70);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"USE",&local_b1);
    pmVar3 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&this->mDEF_Map_Mesh,&pTabLevel_local);
    std::__cxx11::string::string((string *)&local_b0.Value,(string *)pmVar3);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
               *)&mesh,&local_b0);
    SAttribute::~SAttribute(&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    sVar1 = attr_list.
            super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            ._M_impl._M_node._M_size;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,(char *)sVar1,
               (allocator<char> *)(mesh_name.field_2._M_local_buf + 0xf));
    NodeHelper_OpenNode(this,&local_d8,pTabLevel,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&mesh);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)(mesh_name.field_2._M_local_buf + 0xf));
    mesh_name.field_2._8_4_ = 1;
  }
  else {
    __lhs = aiString::C_Str(&local_50->mName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"_IDX_",&local_141);
    std::operator+(&local_120,__lhs,&local_140);
    std::__cxx11::to_string(&local_168,pTabLevel_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   &local_120,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"DEF",&local_1a9);
    std::__cxx11::string::string((string *)&local_1a8.Value,(string *)local_100);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
               *)&mesh,&local_1a8);
    SAttribute::~SAttribute(&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    pmVar3 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->mDEF_Map_Mesh,&pTabLevel_local);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)local_100);
    sVar1 = attr_list.
            super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            ._M_impl._M_node._M_size;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,(char *)sVar1,
               (allocator<char> *)(coordIndex.field_2._M_local_buf + 0xf));
    NodeHelper_OpenNode(this,&local_1d0,pTabLevel,false,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&mesh);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)(coordIndex.field_2._M_local_buf + 0xf));
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
              ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                *)&mesh);
    Export_Material(this,(ulong)local_50->mMaterialIndex,pTabLevel + 1);
    std::__cxx11::string::string((string *)&idx_face);
    std::__cxx11::string::reserve((ulong)&idx_face);
    for (face_cur = (aiFace *)0x0; face_cur < (aiFace *)(ulong)local_50->mNumFaces;
        face_cur = (aiFace *)((long)&face_cur->mNumIndices + 1)) {
      idx_vert = (size_t)(local_50->mFaces + (long)face_cur);
      for (local_210 = 0; local_210 < *(uint *)idx_vert; local_210 = local_210 + 1) {
        std::__cxx11::to_string(&local_250,*(uint *)(*(long *)(idx_vert + 8) + local_210 * 4));
        std::operator+(&local_230,&local_250," ");
        std::__cxx11::string::append((string *)&idx_face);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_250);
      }
      std::__cxx11::string::append((char *)&idx_face);
    }
    std::__cxx11::string::length();
    std::__cxx11::string::resize((ulong)&idx_face);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"coordIndex",&local_291)
    ;
    std::__cxx11::string::string((string *)&local_290.Value,(string *)&idx_face);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
               *)&mesh,&local_290);
    SAttribute::~SAttribute(&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"IndexedFaceSet",
               (allocator<char> *)(attr_value.field_2._M_local_buf + 0xf));
    NodeHelper_OpenNode(this,&local_2b8,pTabLevel + 1,false,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&mesh);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)(attr_value.field_2._M_local_buf + 0xf));
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
              ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                *)&mesh);
    std::__cxx11::string::string((string *)local_2e0);
    AttrHelper_Vec3DArrToString
              (this,local_50->mVertices,(ulong)local_50->mNumVertices,(string *)local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"point",&local_321);
    std::__cxx11::string::string((string *)&local_320.Value,(string *)local_2e0);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
               *)&mesh,&local_320);
    SAttribute::~SAttribute(&local_320);
    std::allocator<char>::~allocator(&local_321);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"Coordinate",&local_349)
    ;
    NodeHelper_OpenNode(this,&local_348,pTabLevel + 2,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&mesh);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
              ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                *)&mesh);
    bVar2 = aiMesh::HasVertexColors(local_50,0);
    if (bVar2) {
      AttrHelper_Col4DArrToString
                (this,local_50->mColors[0],(ulong)local_50->mNumVertices,(string *)local_2e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"color",&local_391);
      std::__cxx11::string::string((string *)&local_390.Value,(string *)local_2e0);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
      push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                 *)&mesh,&local_390);
      SAttribute::~SAttribute(&local_390);
      std::allocator<char>::~allocator(&local_391);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,"ColorRGBA",&local_3b9);
      NodeHelper_OpenNode(this,&local_3b8,pTabLevel + 2,true,
                          (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)&mesh);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator(&local_3b9);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
                ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                  *)&mesh);
    }
    bVar2 = aiMesh::HasTextureCoords(local_50,0);
    if (bVar2) {
      AttrHelper_Vec3DAsVec2fArrToString
                (this,local_50->mTextureCoords[0],(ulong)local_50->mNumVertices,(string *)local_2e0)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"point",&local_401);
      std::__cxx11::string::string((string *)&local_400.Value,(string *)local_2e0);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
      push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                 *)&mesh,&local_400);
      SAttribute::~SAttribute(&local_400);
      std::allocator<char>::~allocator(&local_401);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_428,"TextureCoordinate",&local_429);
      NodeHelper_OpenNode(this,&local_428,pTabLevel + 2,true,
                          (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)&mesh);
      std::__cxx11::string::~string((string *)&local_428);
      std::allocator<char>::~allocator(&local_429);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
                ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                  *)&mesh);
    }
    bVar2 = aiMesh::HasNormals(local_50);
    if (bVar2) {
      AttrHelper_Vec3DArrToString
                (this,local_50->mNormals,(ulong)local_50->mNumVertices,(string *)local_2e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"vector",&local_471);
      std::__cxx11::string::string((string *)&local_470.Value,(string *)local_2e0);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
      push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                 *)&mesh,&local_470);
      SAttribute::~SAttribute(&local_470);
      std::allocator<char>::~allocator(&local_471);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"Normal",&local_499);
      NodeHelper_OpenNode(this,&local_498,pTabLevel + 2,true,
                          (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)&mesh);
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator(&local_499);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
                ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                  *)&mesh);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"IndexedFaceSet",&local_4c1);
    NodeHelper_CloseNode(this,&local_4c0,pTabLevel + 1);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    sVar1 = attr_list.
            super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            ._M_impl._M_node._M_size;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e8,(char *)sVar1,&local_4e9);
    NodeHelper_CloseNode(this,&local_4e8,pTabLevel);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    std::__cxx11::string::~string((string *)local_2e0);
    std::__cxx11::string::~string((string *)&idx_face);
    std::__cxx11::string::~string((string *)local_100);
    mesh_name.field_2._8_4_ = 0;
  }
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::~list
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)&mesh);
  return;
}

Assistant:

void X3DExporter::Export_Mesh(const size_t pIdxMesh, const size_t pTabLevel)
{
const char* NodeName_IFS = "IndexedFaceSet";
const char* NodeName_Shape = "Shape";

list<SAttribute> attr_list;
aiMesh& mesh = *mScene->mMeshes[pIdxMesh];// create alias for conveniance.

	// Check if mesh already defined early.
	if(mDEF_Map_Mesh.find(pIdxMesh) != mDEF_Map_Mesh.end())
	{
		// Mesh already defined, just refer to it
		attr_list.push_back({"USE", mDEF_Map_Mesh.at(pIdxMesh)});
		NodeHelper_OpenNode(NodeName_Shape, pTabLevel, true, attr_list);

		return;
	}

	string mesh_name(mesh.mName.C_Str() + string("_IDX_") + to_string(pIdxMesh));// Create mesh name

	// Define mesh name.
	attr_list.push_back({"DEF", mesh_name});
	mDEF_Map_Mesh[pIdxMesh] = mesh_name;

	//
	// "Shape" node.
	//
	NodeHelper_OpenNode(NodeName_Shape, pTabLevel, false, attr_list);
	attr_list.clear();

	//
	// "Appearance" node.
	//
	Export_Material(mesh.mMaterialIndex, pTabLevel + 1);

	//
	// "IndexedFaceSet" node.
	//
	// Fill attributes which differ from default. In Assimp for colors, vertices and normals used one indices set. So, only "coordIndex" must be set.
	string coordIndex;

	// fill coordinates index.
	coordIndex.reserve(mesh.mNumVertices * 4);// Index + space + Face delimiter
	for(size_t idx_face = 0; idx_face < mesh.mNumFaces; idx_face++)
	{
		const aiFace& face_cur = mesh.mFaces[idx_face];

		for(size_t idx_vert = 0; idx_vert < face_cur.mNumIndices; idx_vert++)
		{
			coordIndex.append(to_string(face_cur.mIndices[idx_vert]) + " ");
		}

		coordIndex.append("-1 ");// face delimiter.
	}

	// remove last space symbol.
	coordIndex.resize(coordIndex.length() - 1);
	attr_list.push_back({"coordIndex", coordIndex});
	// create node
	NodeHelper_OpenNode(NodeName_IFS, pTabLevel + 1, false, attr_list);
	attr_list.clear();
	// Child nodes for "IndexedFaceSet" needed when used colors, textures or normals.
	string attr_value;

	// Export <Coordinate>
	AttrHelper_Vec3DArrToString(mesh.mVertices, mesh.mNumVertices, attr_value);
	attr_list.push_back({"point", attr_value});
	NodeHelper_OpenNode("Coordinate", pTabLevel + 2, true, attr_list);
	attr_list.clear();

	// Export <ColorRGBA>
	if(mesh.HasVertexColors(0))
	{
		AttrHelper_Col4DArrToString(mesh.mColors[0], mesh.mNumVertices, attr_value);
		attr_list.push_back({"color", attr_value});
		NodeHelper_OpenNode("ColorRGBA", pTabLevel + 2, true, attr_list);
		attr_list.clear();
	}

	// Export <TextureCoordinate>
	if(mesh.HasTextureCoords(0))
	{
		AttrHelper_Vec3DAsVec2fArrToString(mesh.mTextureCoords[0], mesh.mNumVertices, attr_value);
		attr_list.push_back({"point", attr_value});
		NodeHelper_OpenNode("TextureCoordinate", pTabLevel + 2, true, attr_list);
		attr_list.clear();
	}

	// Export <Normal>
	if(mesh.HasNormals())
	{
		AttrHelper_Vec3DArrToString(mesh.mNormals, mesh.mNumVertices, attr_value);
		attr_list.push_back({"vector", attr_value});
		NodeHelper_OpenNode("Normal", pTabLevel + 2, true, attr_list);
		attr_list.clear();
	}

	//
	// Close opened nodes.
	//
	NodeHelper_CloseNode(NodeName_IFS, pTabLevel + 1);
	NodeHelper_CloseNode(NodeName_Shape, pTabLevel);
}